

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uint128.hpp
# Opt level: O0

uint128 * __thiscall trng::portable_impl::uint128::operator*=(uint128 *this,uint128 other)

{
  uint128 other_00;
  uint128 other_01;
  ulong in_RDX;
  ulong in_RSI;
  uint128 *in_RDI;
  uint64_t m9;
  uint64_t m8;
  uint64_t m7;
  uint64_t m6;
  uint64_t m5;
  uint64_t m4;
  uint64_t m3;
  uint128 m2;
  uint128 m1;
  uint128 m0;
  uint64_t other_hi1;
  uint64_t other_hi0;
  uint64_t other_lo1;
  uint64_t other_lo0;
  uint64_t hi1;
  uint64_t hi0;
  uint64_t lo1;
  uint64_t lo0;
  uint128 local_98;
  uint64_t local_88;
  uint64_t local_80;
  uint128 local_78;
  uint128 local_68;
  ulong local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  ulong local_20;
  
  local_20 = in_RDI->m_lo & 0xffffffff;
  local_28 = in_RDI->m_lo >> 0x20;
  local_30 = in_RDI->m_hi & 0xffffffff;
  local_38 = in_RDI->m_hi >> 0x20;
  local_40 = in_RSI & 0xffffffff;
  local_48 = in_RSI >> 0x20;
  local_50 = in_RDX & 0xffffffff;
  local_58 = in_RDX >> 0x20;
  uint128(&local_68,0,local_20 * local_40);
  in_RDI->m_lo = local_68.m_lo;
  in_RDI->m_hi = local_68.m_hi;
  uint128(&local_78,local_28 * local_40 >> 0x20,local_28 * local_40 << 0x20);
  local_88 = local_78.m_lo;
  local_80 = local_78.m_hi;
  other_01.m_hi = local_78.m_hi;
  other_01.m_lo = local_78.m_lo;
  operator+=(in_RDI,other_01);
  uint128(&local_98,local_20 * local_48 >> 0x20,local_20 * local_48 << 0x20);
  other_00.m_hi = local_98.m_hi;
  other_00.m_lo = local_98.m_lo;
  operator+=(in_RDI,other_00);
  in_RDI->m_hi = local_30 * local_40 + in_RDI->m_hi;
  in_RDI->m_hi = local_20 * local_50 + in_RDI->m_hi;
  in_RDI->m_hi = local_28 * local_48 + in_RDI->m_hi;
  in_RDI->m_hi = (local_38 * local_40 << 0x20) + in_RDI->m_hi;
  in_RDI->m_hi = (local_20 * local_58 << 0x20) + in_RDI->m_hi;
  in_RDI->m_hi = (local_30 * local_48 << 0x20) + in_RDI->m_hi;
  in_RDI->m_hi = (local_28 * local_50 << 0x20) + in_RDI->m_hi;
  return in_RDI;
}

Assistant:

uint128 &operator*=(uint128 other) {
        const auto lo0{m_lo & 0xffffffff};
        const auto lo1{m_lo >> 32};
        const auto hi0{m_hi & 0xffffffff};
        const auto hi1{m_hi >> 32};

        const auto other_lo0{other.m_lo & 0xffffffff};
        const auto other_lo1{other.m_lo >> 32};
        const auto other_hi0{other.m_hi & 0xffffffff};
        const auto other_hi1{other.m_hi >> 32};

        const uint128 m0{0, lo0 * other_lo0};
        *this = m0;
        const uint128 m1{(lo1 * other_lo0) >> 32, (lo1 * other_lo0) << 32};
        *this += m1;
        const uint128 m2{(lo0 * other_lo1) >> 32, (lo0 * other_lo1) << 32};
        *this += m2;
        const std::uint64_t m3{hi0 * other_lo0};
        this->m_hi += m3;
        const std::uint64_t m4{lo0 * other_hi0};
        this->m_hi += m4;
        const std::uint64_t m5{lo1 * other_lo1};
        this->m_hi += m5;
        const std::uint64_t m6{(hi1 * other_lo0) << 32};
        this->m_hi += m6;
        const std::uint64_t m7{(lo0 * other_hi1) << 32};
        this->m_hi += m7;
        const std::uint64_t m8{(hi0 * other_lo1) << 32};
        this->m_hi += m8;
        const std::uint64_t m9{(lo1 * other_hi0) << 32};
        this->m_hi += m9;
        return *this;
      }